

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O2

void __thiscall helics::CoreApp::reset(CoreApp *this)

{
  CLI::std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)this);
  (this->name)._M_string_length = 0;
  *(this->name)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void CoreApp::reset()
{
    core.reset();
    name.clear();
}